

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadBone_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Node *pNVar4;
  _Elt_pointer psVar5;
  LineSplitter *splitter_00;
  ChunkInfo *pCVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<Assimp::COB::Node> local_38;
  
  if (5 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Bone");
    return;
  }
  pCVar6 = nfo;
  pNVar4 = (Node *)operator_new(0xd8);
  COB::Node::Node(pNVar4,TYPE_BONE);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_008000f0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Bone*>
            (&_Stack_40,(Bone *)pNVar4);
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pNVar4;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,&local_38);
  if (local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  psVar5 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar5 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar6 = (ChunkInfo *)
             (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar5 = (_Elt_pointer)(*(long *)&pCVar6[-1].version + 0x200);
  }
  pNVar4 = psVar5[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = nfo->parent_id;
  uVar2 = nfo->version;
  uVar3 = nfo->size;
  (pNVar4->super_ChunkInfo).id = nfo->id;
  (pNVar4->super_ChunkInfo).parent_id = uVar1;
  (pNVar4->super_ChunkInfo).version = uVar2;
  (pNVar4->super_ChunkInfo).size = uVar3;
  splitter_00 = LineSplitter::operator++(splitter);
  ReadBasicNodeInfo_Ascii((COBImporter *)splitter,pNVar4,splitter_00,pCVar6);
  return;
}

Assistant:

void COBImporter::ReadBone_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 5) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Bone");
    }

    out.nodes.push_back(std::shared_ptr<Bone>(new Bone()));
    Bone& msh = (Bone&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    // TODO
}